

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseTableModuleField(WastParser *this,Module *module)

{
  Limits *out_limits;
  pointer ppTVar1;
  pointer ppTVar2;
  undefined1 auVar3 [8];
  Type TVar4;
  bool bVar5;
  Result RVar6;
  TokenType TVar7;
  reference pvVar8;
  char *pcVar9;
  Enum EVar10;
  _Head_base<0UL,_wabt::TableImport_*,_false> _Var11;
  vector<wabt::intrusive_list<wabt::Expr>,std::allocator<wabt::intrusive_list<wabt::Expr>>> *this_00
  ;
  undefined1 local_140 [8];
  ExprList elem_expr;
  Enum local_110;
  Index IStack_10c;
  _Head_base<0UL,_wabt::TableModuleField_*,_false> local_108;
  undefined1 local_100 [16];
  _Head_base<0UL,_wabt::Expr_*,_false> local_f0;
  Type elem_type;
  _Head_base<0UL,_wabt::TableImport_*,_false> local_e0;
  string name;
  Location loc;
  ModuleFieldList export_fields;
  Const offset;
  
  RVar6 = Expect(this,Lpar);
  if (RVar6.enum_ == Error) {
    return (Result)Error;
  }
  GetLocation(&loc,this);
  RVar6 = Expect(this,Table);
  if (RVar6.enum_ == Error) {
    return (Result)Error;
  }
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  ParseBindVarOpt(this,&name);
  export_fields.first_ = (ModuleField *)0x0;
  export_fields.last_ = (ModuleField *)0x0;
  export_fields.size_ = 0;
  EVar10 = Error;
  RVar6 = ParseInlineExports(this,&export_fields,Table);
  if (RVar6.enum_ == Error) goto LAB_001386db;
  bVar5 = PeekMatchLpar(this,Import);
  if (bVar5) {
    CheckImportOrdering(this,module);
    std::make_unique<wabt::TableImport,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&elem_expr);
    RVar6 = ParseInlineImport(this,(Import *)elem_expr.first_);
    _Var11._M_head_impl = (TableImport *)elem_expr.first_;
    if (((RVar6.enum_ != Error) &&
        (RVar6 = ParseLimitsIndex(this,(Limits *)((long)&elem_expr.first_[1].loc.field_1 + 8)),
        _Var11._M_head_impl = (TableImport *)elem_expr.first_, RVar6.enum_ != Error)) &&
       ((RVar6 = ParseLimits(this,(Limits *)((long)&elem_expr.first_[1].loc.field_1 + 8)),
        _Var11._M_head_impl = (TableImport *)elem_expr.first_, RVar6.enum_ != Error &&
        (RVar6 = ParseRefType(this,(Type *)&elem_expr.first_[2].
                                            super_intrusive_list_base<wabt::Expr>),
        _Var11._M_head_impl = (TableImport *)elem_expr.first_, RVar6.enum_ != Error)))) {
      GetLocation(&offset.loc,this);
      std::
      make_unique<wabt::ImportModuleField,std::unique_ptr<wabt::TableImport,std::default_delete<wabt::TableImport>>,wabt::Location>
                ((unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_> *)local_140
                 ,(Location *)&elem_expr);
      local_e0._M_head_impl = (TableImport *)local_140;
      local_140 = (undefined1  [8])0x0;
      Module::AppendField(module,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                  *)&local_e0);
      if (local_e0._M_head_impl != (TableImport *)0x0) {
        (*((local_e0._M_head_impl)->super_ImportMixin<(wabt::ExternalKind)1>).super_Import.
          _vptr_Import[1])();
      }
      local_e0._M_head_impl = (TableImport *)0x0;
      _Var11._M_head_impl = (TableImport *)elem_expr.first_;
      if ((_Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>)local_140
          != (TableImport *)0x0) {
        (**(code **)(*(long *)local_140 + 8))();
        _Var11._M_head_impl = (TableImport *)elem_expr.first_;
      }
      goto LAB_001388bf;
    }
  }
  else {
    std::make_unique<wabt::TableModuleField,wabt::Location&,std::__cxx11::string&>
              ((Location *)local_140,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&loc);
    auVar3 = local_140;
    out_limits = (Limits *)((long)local_140 + 0x60);
    RVar6 = ParseLimitsIndex(this,out_limits);
    _Var11._M_head_impl = (TableImport *)local_140;
    if (RVar6.enum_ != Error) {
      TVar7 = Peek(this,0);
      if (TVar7 == First_Type) {
        RVar6 = ParseRefType(this,&elem_type);
        _Var11._M_head_impl = (TableImport *)local_140;
        if (((RVar6.enum_ != Error) &&
            (RVar6 = Expect(this,Lpar), _Var11._M_head_impl = (TableImport *)local_140,
            RVar6.enum_ != Error)) &&
           (RVar6 = Expect(this,Elem), _Var11._M_head_impl = (TableImport *)local_140,
           RVar6.enum_ != Error)) {
          std::make_unique<wabt::ElemSegmentModuleField,wabt::Location&>
                    ((Location *)&stack0xfffffffffffffef0);
          TVar4 = _local_110;
          ppTVar1 = (module->tables).
                    super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          ppTVar2 = (module->tables).
                    super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          GetLocation((Location *)&elem_expr,this);
          Var::Var((Var *)&offset,(Index)((ulong)((long)ppTVar1 - (long)ppTVar2) >> 3),
                   (Location *)&elem_expr);
          Var::operator=((Var *)((long)TVar4 + 0x68),(Var *)&offset);
          Var::~Var((Var *)&offset);
          if (*(bool *)((long)auVar3 + 0x72) == true) {
            elem_expr.size_._0_4_ = 0;
            elem_expr.size_._4_4_ = 0;
            elem_expr.first_ = (Expr *)0x0;
            elem_expr.last_._0_4_ = 0;
            elem_expr.last_._4_4_ = 0;
            Const::I64(&offset,0,(Location *)&elem_expr);
          }
          else {
            elem_expr.size_._0_4_ = 0;
            elem_expr.size_._4_4_ = 0;
            elem_expr.first_ = (Expr *)0x0;
            elem_expr.last_._0_4_ = 0;
            elem_expr.last_._4_4_ = 0;
            Const::I32(&offset,0,(Location *)&elem_expr);
          }
          std::make_unique<wabt::ConstExpr,wabt::Const&>((Const *)&elem_expr);
          local_f0._M_head_impl = elem_expr.first_;
          elem_expr.first_ = (Expr *)0x0;
          intrusive_list<wabt::Expr>::push_back
                    ((intrusive_list<wabt::Expr> *)((long)TVar4 + 0xb8),
                     (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_f0);
          if (local_f0._M_head_impl != (Expr *)0x0) {
            (*(local_f0._M_head_impl)->_vptr_Expr[1])();
          }
          local_f0._M_head_impl = (Expr *)0x0;
          if (elem_expr.first_ != (Expr *)0x0) {
            (*(elem_expr.first_)->_vptr_Expr[1])();
          }
          pvVar8 = intrusive_list<wabt::Expr>::back
                             ((intrusive_list<wabt::Expr> *)((long)TVar4 + 0xb8));
          (pvVar8->loc).filename._M_len = loc.filename._M_len;
          (pvVar8->loc).filename._M_str = loc.filename._M_str;
          (pvVar8->loc).field_1.field_1.offset = (size_t)loc.field_1.field_1.offset;
          *(undefined8 *)((long)&(pvVar8->loc).field_1 + 8) = loc.field_1._8_8_;
          *(Type *)((long)TVar4 + 0xb0) = elem_type;
          elem_expr.first_ = (Expr *)0x0;
          elem_expr.last_._0_4_ = 0;
          elem_expr.last_._4_4_ = 0;
          elem_expr.size_._0_4_ = 0;
          elem_expr.size_._4_4_ = 0;
          bVar5 = ParseElemExprOpt(this,&elem_expr);
          this_00 = (vector<wabt::intrusive_list<wabt::Expr>,std::allocator<wabt::intrusive_list<wabt::Expr>>>
                     *)((long)TVar4 + 0xd0);
          if (bVar5) {
            std::
            vector<wabt::intrusive_list<wabt::Expr>,std::allocator<wabt::intrusive_list<wabt::Expr>>>
            ::emplace_back<wabt::intrusive_list<wabt::Expr>>(this_00,&elem_expr);
            ParseElemExprListOpt(this,(ExprListVector *)this_00);
          }
          else {
            ParseElemExprVarListOpt(this,(ExprListVector *)this_00);
          }
          RVar6 = Expect(this,Rpar);
          if (RVar6.enum_ != Error) {
            pcVar9 = (char *)((*(long *)((long)TVar4 + 0xd8) - *(long *)((long)TVar4 + 0xd0)) / 0x18
                             );
            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((long)auVar3 + 0x60))->_M_allocated_capacity = (size_type)pcVar9;
            (((anon_union_16_2_ecfd7102_for_Location_1 *)((long)auVar3 + 0x68))->field_1).offset =
                 (size_t)pcVar9;
            *(bool *)&((Limits *)((long)auVar3 + 0x70))->initial = true;
            *(Type *)((long)auVar3 + 0x78) = elem_type;
            local_100._8_8_ = local_140;
            local_140 = (undefined1  [8])0x0;
            Module::AppendField(module,(unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
                                        *)(local_100 + 8));
            if ((Expr *)local_100._8_8_ != (Expr *)0x0) {
              (**(code **)(*(long *)local_100._8_8_ + 8))();
            }
            local_100._8_8_ = 0;
            local_100._0_4_ = local_110;
            local_100._4_4_ = IStack_10c;
            local_110 = Any;
            IStack_10c = 0;
            Module::AppendField(module,(unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
                                        *)local_100);
            if (local_100._0_8_ != 0) {
              (**(code **)(*(long *)local_100._0_8_ + 8))();
            }
            local_100._0_8_ = 0;
          }
          intrusive_list<wabt::Expr>::clear(&elem_expr);
          if (_local_110 != (Type)0x0) {
            (**(code **)(*(long *)_local_110 + 8))();
          }
          _Var11._M_head_impl = (TableImport *)local_140;
          if (RVar6.enum_ != Error) goto LAB_001388bf;
        }
      }
      else {
        RVar6 = ParseLimits(this,out_limits);
        _Var11._M_head_impl = (TableImport *)local_140;
        if ((RVar6.enum_ != Error) &&
           (RVar6 = ParseRefType(this,(Type *)((long)auVar3 + 0x78)),
           _Var11._M_head_impl = (TableImport *)local_140, RVar6.enum_ != Error)) {
          local_108._M_head_impl = (TableModuleField *)local_140;
          local_140 = (undefined1  [8])0x0;
          Module::AppendField(module,(unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
                                      *)&local_108);
          if (local_108._M_head_impl != (TableModuleField *)0x0) {
            (*((local_108._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).
              super_ModuleField._vptr_ModuleField[1])();
          }
          local_108._M_head_impl = (TableModuleField *)0x0;
          _Var11._M_head_impl = (TableImport *)local_140;
LAB_001388bf:
          if ((_Head_base<0UL,_wabt::TableImport_*,_false>)_Var11._M_head_impl !=
              (_Head_base<0UL,_wabt::TableImport_*,_false>)0x0) {
            (*((_Var11._M_head_impl)->super_ImportMixin<(wabt::ExternalKind)1>).super_Import.
              _vptr_Import[1])();
          }
          anon_unknown_1::AppendInlineExportFields
                    (module,&export_fields,
                     (int)((ulong)((long)(module->tables).
                                         super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(module->tables).
                                        super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1);
          RVar6 = Expect(this,Rpar);
          EVar10 = (Enum)(RVar6.enum_ == Error);
          goto LAB_001386db;
        }
      }
    }
  }
  if (_Var11._M_head_impl != (TableImport *)0x0) {
    (*((_Var11._M_head_impl)->super_ImportMixin<(wabt::ExternalKind)1>).super_Import._vptr_Import[1]
    )();
  }
LAB_001386db:
  intrusive_list<wabt::ModuleField>::clear(&export_fields);
  std::__cxx11::string::_M_dispose();
  return (Result)EVar10;
}

Assistant:

Result WastParser::ParseTableModuleField(Module* module) {
  WABT_TRACE(ParseTableModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Table);
  std::string name;
  ParseBindVarOpt(&name);

  ModuleFieldList export_fields;
  CHECK_RESULT(ParseInlineExports(&export_fields, ExternalKind::Table));

  if (PeekMatchLpar(TokenType::Import)) {
    CheckImportOrdering(module);
    auto import = std::make_unique<TableImport>(name);
    CHECK_RESULT(ParseInlineImport(import.get()));
    CHECK_RESULT(ParseLimitsIndex(&import->table.elem_limits));
    CHECK_RESULT(ParseLimits(&import->table.elem_limits));
    CHECK_RESULT(ParseRefType(&import->table.elem_type));
    auto field =
        std::make_unique<ImportModuleField>(std::move(import), GetLocation());
    module->AppendField(std::move(field));
  } else {
    auto field = std::make_unique<TableModuleField>(loc, name);
    auto& table = field->table;
    CHECK_RESULT(ParseLimitsIndex(&table.elem_limits));
    if (PeekMatch(TokenType::ValueType)) {
      Type elem_type;
      CHECK_RESULT(ParseRefType(&elem_type));

      EXPECT(Lpar);
      EXPECT(Elem);

      auto elem_segment_field = std::make_unique<ElemSegmentModuleField>(loc);
      ElemSegment& elem_segment = elem_segment_field->elem_segment;
      elem_segment.table_var = Var(module->tables.size(), GetLocation());
      auto offset = table.elem_limits.is_64 ? Const::I64(0) : Const::I32(0);
      elem_segment.offset.push_back(std::make_unique<ConstExpr>(offset));
      elem_segment.offset.back().loc = loc;
      elem_segment.elem_type = elem_type;
      // Syntax is either an optional list of var (legacy), or a non-empty list
      // of elem expr.
      ExprList elem_expr;
      if (ParseElemExprOpt(&elem_expr)) {
        elem_segment.elem_exprs.push_back(std::move(elem_expr));
        // Parse the rest.
        ParseElemExprListOpt(&elem_segment.elem_exprs);
      } else {
        ParseElemExprVarListOpt(&elem_segment.elem_exprs);
      }
      EXPECT(Rpar);

      table.elem_limits.initial = elem_segment.elem_exprs.size();
      table.elem_limits.max = elem_segment.elem_exprs.size();
      table.elem_limits.has_max = true;
      table.elem_type = elem_type;
      module->AppendField(std::move(field));
      module->AppendField(std::move(elem_segment_field));
    } else {
      CHECK_RESULT(ParseLimits(&table.elem_limits));
      CHECK_RESULT(ParseRefType(&table.elem_type));
      module->AppendField(std::move(field));
    }
  }

  AppendInlineExportFields(module, &export_fields, module->tables.size() - 1);

  EXPECT(Rpar);
  return Result::Ok;
}